

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_transform_feedback(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_transform_feedback != 0) {
    glad_glBeginTransformFeedbackNV =
         (PFNGLBEGINTRANSFORMFEEDBACKNVPROC)(*load)("glBeginTransformFeedbackNV");
    glad_glEndTransformFeedbackNV =
         (PFNGLENDTRANSFORMFEEDBACKNVPROC)(*load)("glEndTransformFeedbackNV");
    glad_glTransformFeedbackAttribsNV =
         (PFNGLTRANSFORMFEEDBACKATTRIBSNVPROC)(*load)("glTransformFeedbackAttribsNV");
    glad_glBindBufferRangeNV = (PFNGLBINDBUFFERRANGENVPROC)(*load)("glBindBufferRangeNV");
    glad_glBindBufferOffsetNV = (PFNGLBINDBUFFEROFFSETNVPROC)(*load)("glBindBufferOffsetNV");
    glad_glBindBufferBaseNV = (PFNGLBINDBUFFERBASENVPROC)(*load)("glBindBufferBaseNV");
    glad_glTransformFeedbackVaryingsNV =
         (PFNGLTRANSFORMFEEDBACKVARYINGSNVPROC)(*load)("glTransformFeedbackVaryingsNV");
    glad_glActiveVaryingNV = (PFNGLACTIVEVARYINGNVPROC)(*load)("glActiveVaryingNV");
    glad_glGetVaryingLocationNV = (PFNGLGETVARYINGLOCATIONNVPROC)(*load)("glGetVaryingLocationNV");
    glad_glGetActiveVaryingNV = (PFNGLGETACTIVEVARYINGNVPROC)(*load)("glGetActiveVaryingNV");
    glad_glGetTransformFeedbackVaryingNV =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGNVPROC)(*load)("glGetTransformFeedbackVaryingNV");
    glad_glTransformFeedbackStreamAttribsNV =
         (PFNGLTRANSFORMFEEDBACKSTREAMATTRIBSNVPROC)(*load)("glTransformFeedbackStreamAttribsNV");
  }
  return;
}

Assistant:

static void load_GL_NV_transform_feedback(GLADloadproc load) {
	if(!GLAD_GL_NV_transform_feedback) return;
	glad_glBeginTransformFeedbackNV = (PFNGLBEGINTRANSFORMFEEDBACKNVPROC)load("glBeginTransformFeedbackNV");
	glad_glEndTransformFeedbackNV = (PFNGLENDTRANSFORMFEEDBACKNVPROC)load("glEndTransformFeedbackNV");
	glad_glTransformFeedbackAttribsNV = (PFNGLTRANSFORMFEEDBACKATTRIBSNVPROC)load("glTransformFeedbackAttribsNV");
	glad_glBindBufferRangeNV = (PFNGLBINDBUFFERRANGENVPROC)load("glBindBufferRangeNV");
	glad_glBindBufferOffsetNV = (PFNGLBINDBUFFEROFFSETNVPROC)load("glBindBufferOffsetNV");
	glad_glBindBufferBaseNV = (PFNGLBINDBUFFERBASENVPROC)load("glBindBufferBaseNV");
	glad_glTransformFeedbackVaryingsNV = (PFNGLTRANSFORMFEEDBACKVARYINGSNVPROC)load("glTransformFeedbackVaryingsNV");
	glad_glActiveVaryingNV = (PFNGLACTIVEVARYINGNVPROC)load("glActiveVaryingNV");
	glad_glGetVaryingLocationNV = (PFNGLGETVARYINGLOCATIONNVPROC)load("glGetVaryingLocationNV");
	glad_glGetActiveVaryingNV = (PFNGLGETACTIVEVARYINGNVPROC)load("glGetActiveVaryingNV");
	glad_glGetTransformFeedbackVaryingNV = (PFNGLGETTRANSFORMFEEDBACKVARYINGNVPROC)load("glGetTransformFeedbackVaryingNV");
	glad_glTransformFeedbackStreamAttribsNV = (PFNGLTRANSFORMFEEDBACKSTREAMATTRIBSNVPROC)load("glTransformFeedbackStreamAttribsNV");
}